

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

int PredictMultiple(void *hPtr,char *input,char ***predictedLabels,float *predictedProbabilities,
                   int n)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  char **ppcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  pointer ppVar9;
  undefined1 auVar10 [16];
  double dVar11;
  allocator<char> local_1fd;
  uint local_1fc;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  string local_1d0 [32];
  istringstream inStream;
  
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,input,&local_1fd);
  std::__cxx11::istringstream::istringstream((istringstream *)&inStream,local_1d0,_S_in);
  std::__cxx11::string::~string(local_1d0);
  bVar2 = fasttext::FastText::predictLine((FastText *)hPtr,(istream *)&inStream,&predictions,n,0.0);
  ppVar9 = predictions.
           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  if (bVar2) {
    uVar8 = 0;
    if ((long)predictions.
              super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)predictions.
              super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar3 = ((long)predictions.
                     super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)predictions.
                    super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28;
      auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar10._0_8_ = lVar3;
      auVar10._12_4_ = 0x45300000;
      dVar11 = (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
      if ((double)n <= dVar11) {
        dVar11 = (double)n;
      }
      uVar8 = (uint)dVar11;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)uVar8) {
        uVar6 = (long)(int)uVar8 * 8;
      }
      ppcVar4 = (char **)operator_new__(uVar6);
      uVar6 = 0;
      uVar7 = 0;
      if (0 < (int)uVar8) {
        uVar7 = (ulong)uVar8;
      }
      lVar3 = 8;
      local_1fc = uVar8;
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        uVar1 = *(ulong *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar3);
        pcVar5 = (char *)operator_new__(uVar1 + 1);
        ppcVar4[uVar6] = pcVar5;
        std::__cxx11::string::copy((char *)((long)&ppVar9->first + lVar3),(ulong)pcVar5,uVar1);
        ppcVar4[uVar6][uVar1] = '\0';
        predictedProbabilities[uVar6] =
             *(float *)((long)predictions.
                              super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8);
        lVar3 = lVar3 + 0x28;
        ppVar9 = predictions.
                 super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *predictedLabels = ppcVar4;
      uVar8 = local_1fc;
    }
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&inStream);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&predictions);
  return uVar8;
}

Assistant:

PredictMultiple(void* hPtr, const char* input, char*** predictedLabels, float* predictedProbabilities, int n)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    std::vector<std::pair<real,std::string>> predictions;
    std::istringstream inStream(input);

    try {
        if (!fastText->predictLine(inStream, predictions, n, 0)) {
            return 0;
        }

        if (predictions.size()==0) {
            return 0;
        }
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    int cnt = fmin(predictions.size(), n);
    auto labels = new char*[cnt];
    for (int i = 0; i < cnt; ++i)
    {
        auto len = predictions[i].second.length();
        labels[i] = new char[len + 1];
        predictions[i].second.copy(labels[i], len);
        labels[i][len] = '\0';
        predictedProbabilities[i] = predictions[i].first;
    }

    *(predictedLabels) = labels;

    return cnt;
}